

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O2

PList * p_ini_file_sections(PIniFile *file)

{
  pchar *data;
  PList *list;
  
  if ((file == (PIniFile *)0x0) || (file->is_parsed == 0)) {
    list = (PList *)0x0;
  }
  else {
    list = (PList *)0x0;
    while (file = (PIniFile *)file->sections, file != (PIniFile *)0x0) {
      data = p_strdup(*(pchar **)file->path);
      list = p_list_prepend(list,data);
    }
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_ini_file_sections (const PIniFile *file)
{
	PList	*ret;
	PList	*sec;

	if (P_UNLIKELY (file == NULL || file->is_parsed == FALSE))
		return NULL;

	ret = NULL;

	for (sec = file->sections; sec != NULL; sec = sec->next)
		ret = p_list_prepend (ret, p_strdup (((PIniSection *) sec->data)->name));

	return ret;
}